

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O0

void __thiscall Threadpool::add_thread(Threadpool *this,unsigned_short size)

{
  size_type sVar1;
  type local_20;
  unsigned_short local_12;
  Threadpool *pTStack_10;
  unsigned_short size_local;
  Threadpool *this_local;
  
  local_12 = size;
  pTStack_10 = this;
  while (sVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->tp_pool),
        sVar1 < 0x40 && local_12 != 0) {
    local_20.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<Threadpool::add_thread(unsigned_short)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)this,&local_20);
    std::__atomic_base<int>::operator++(&(this->tp_idl_tnum).super___atomic_base<int>,0);
    local_12 = local_12 - 1;
  }
  return;
}

Assistant:

void add_thread(unsigned short size)
	{
		for (; tp_pool.size() < THREADPOOL_MAX_NUM && size > 0; --size)
		{
			tp_pool.emplace_back( [this]{
				while (tp_run)
				{
					Task task;
					{
						unique_lock<mutex> lock{ tp_lock };
						tp_task_cv.wait(lock, [this]{
								return !tp_run || !tp_tasks.empty();
						});
						if (!tp_run && tp_tasks.empty())
							return;
						task = move(tp_tasks.front());
						tp_tasks.pop();
					}
					tp_idl_tnum--;
					task();
					tp_idl_tnum++;
				}
			});
			tp_idl_tnum++;
		}
	}